

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::Write(ON_Mesh *this,ON_BinaryArchive *file)

{
  double dVar1;
  double dVar2;
  char cVar3;
  ON__UINT32 i;
  uint uVar4;
  ON_MeshCurvatureStats *pOVar5;
  ON_2dPoint *pOVar6;
  ON_MeshNgon *pOVar7;
  ON_3dPoint *pOVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  endian eVar12;
  ON__UINT32 OVar13;
  ON_V5_MeshDoubleVertices *pOVar14;
  uint i_00;
  int i_01;
  bool bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ON_BoundingBox *local_38;
  
  iVar11 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar9 = ON_BinaryArchive::Write3dmChunkVersion(file,3,(uint)(0x3b < iVar11) * 3 + 5);
  OVar13 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  i = (this->m_F).m_count;
  if (((((bVar9) && (bVar9 = ON_BinaryArchive::WriteInt(file,OVar13), bVar9)) &&
       (bVar9 = ON_BinaryArchive::WriteInt(file,i), bVar9)) &&
      ((bVar9 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x270), bVar9 &&
       (bVar9 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x280), bVar9))))
     && ((bVar9 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x240), bVar9 &&
         (bVar9 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x250), bVar9))))
  {
    bVar9 = ON_BinaryArchive::WriteDouble(file,2,this->m_srf_scale);
  }
  else {
    bVar9 = false;
  }
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0xbf8000003f800000;
  local_48 = 0xbf800000bf800000;
  local_38 = &this->m_vertex_bbox;
  bVar10 = ON_BoundingBox::IsNotEmpty(local_38);
  if (bVar10) {
    dVar1 = (this->m_vertex_bbox).m_min.x;
    dVar2 = (this->m_vertex_bbox).m_min.y;
    uVar16 = -(ulong)(dVar1 < 0.0);
    uVar17 = -(ulong)(dVar2 < 0.0);
    local_58 = CONCAT44((float)((double)(uVar17 & 0x3ff0000010000000 | ~uVar17 & 0x3fefffffe0000000)
                               * dVar2),
                        (float)((double)(uVar16 & 0x3ff0000010000000 | ~uVar16 & 0x3fefffffe0000000)
                               * dVar1));
    dVar1 = (this->m_vertex_bbox).m_min.z;
    uVar16 = -(ulong)(dVar1 < 0.0);
    dVar2 = (this->m_vertex_bbox).m_max.x;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar2 = dVar2 * *(double *)(&DAT_006c24e0 + (ulong)(0.0 < dVar2) * 8);
    }
    uStack_50 = CONCAT44((float)dVar2,
                         (float)((double)(~uVar16 & 0x3fefffffe0000000 | uVar16 & 0x3ff0000010000000
                                         ) * dVar1));
    dVar1 = (this->m_vertex_bbox).m_max.y;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar1 = dVar1 * *(double *)(&DAT_006c24e0 + (ulong)(0.0 < dVar1) * 8);
    }
    dVar2 = (this->m_vertex_bbox).m_max.z;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar2 = dVar2 * *(double *)(&DAT_006c24e0 + (ulong)(0.0 < dVar2) * 8);
    }
    local_48 = CONCAT44((float)dVar2,(float)dVar1);
  }
  if (bVar9 == false) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteFloat(file,6,(float *)&local_58);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteFloat(file,6,this->m_nbox[0]);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteFloat(file,4,this->m_tbox[0]);
  if (!bVar9) {
    return false;
  }
  cVar3 = this->m_mesh_is_closed;
  i_01 = ((cVar3 == '\x01') - 1) + (uint)(cVar3 == '\x01');
  if (cVar3 == '\x02') {
    i_01 = 0;
  }
  bVar9 = ON_BinaryArchive::WriteInt(file,i_01);
  if (!bVar9) {
    return false;
  }
  bVar10 = this->m_mesh_parameters != (ON_MeshParameters *)0x0;
  bVar9 = ON_BinaryArchive::WriteChar(file,bVar10);
  if (bVar10 && bVar9) {
    bVar9 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    if (!bVar9) {
      return false;
    }
    bVar9 = ON_MeshParameters::Write(this->m_mesh_parameters,file);
    bVar10 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar9 || !bVar10) {
      return false;
    }
  }
  else if (!bVar9) {
    return false;
  }
  uVar16 = 0;
  do {
    pOVar5 = this->m_kstat[uVar16];
    bVar9 = ON_BinaryArchive::WriteChar(file,pOVar5 != (ON_MeshCurvatureStats *)0x0);
    if (pOVar5 != (ON_MeshCurvatureStats *)0x0) {
      bVar9 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
      if (!bVar9) {
        return false;
      }
      bVar10 = ON_MeshCurvatureStats::Write(this->m_kstat[uVar16],file);
      bVar9 = ON_BinaryArchive::EndWrite3dmChunk(file);
      bVar9 = bVar9 && bVar10;
    }
  } while ((bVar9 != false) && (bVar10 = uVar16 < 3, uVar16 = uVar16 + 1, bVar10));
  if (bVar9 == false) {
    return false;
  }
  bVar9 = WriteFaceArray(this,OVar13,i,file);
  if (!bVar9) {
    return false;
  }
  bVar9 = Write_2(this,OVar13,file);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteInt(file,(uint)this->m_packed_tex_rotate);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteUuid(file,&(this->m_Ttag).m_mapping_id);
  if (OVar13 == 0 || !bVar9) {
    if (!bVar9) {
      return false;
    }
  }
  else {
    uVar4 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
    uVar16 = 0;
    if (OVar13 == uVar4) {
      uVar16 = (ulong)uVar4;
    }
    eVar12 = ON_BinaryArchive::Endian(file);
    pOVar6 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
    if (eVar12 == big_endian) {
      uVar17 = (ulong)(uint)((int)uVar16 * 2);
      ON_BinaryArchive::ToggleByteOrder(uVar17,8,pOVar6,pOVar6);
      bVar9 = ON_BinaryArchive::WriteCompressedBuffer
                        (file,uVar16 << 4,(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a);
      pOVar6 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder(uVar17,8,pOVar6,pOVar6);
    }
    else {
      bVar9 = ON_BinaryArchive::WriteCompressedBuffer(file,uVar16 << 4,pOVar6);
    }
    if (bVar9 == false) {
      return false;
    }
  }
  bVar9 = ON_MappingTag::Write(&this->m_Ttag,file);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_manifold);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_oriented);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_solid);
  if (bVar9 && 0x3b < iVar11) {
    bVar9 = 0 < (this->m_F).m_count;
    bVar15 = (this->m_Ngon).m_count != 0;
    bVar10 = ON_BinaryArchive::WriteBool(file,bVar15 && bVar9);
    if ((bVar15 && bVar9) && bVar10) {
      bVar9 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
      if (!bVar9) {
        return false;
      }
      uVar4 = (this->m_Ngon).m_count;
      bVar9 = ON_BinaryArchive::WriteInt(file,uVar4);
      if (!bVar9) goto LAB_004fbb63;
      uVar16 = 0;
      if ((ulong)uVar4 != 0) {
        do {
          pOVar7 = (this->m_Ngon).m_a[uVar16];
          i_00 = 0;
          if ((((pOVar7 != (ON_MeshNgon *)0x0) && (pOVar7->m_Vcount != 0)) &&
              (pOVar7->m_Fcount != 0)) &&
             ((pOVar7->m_vi != (uint *)0x0 && (i_00 = 0, pOVar7->m_fi != (uint *)0x0)))) {
            i_00 = pOVar7->m_Vcount;
          }
          bVar9 = ON_BinaryArchive::WriteInt(file,i_00);
          if ((!bVar9) ||
             ((i_00 != 0 &&
              (((bVar9 = ON_BinaryArchive::WriteInt(file,pOVar7->m_Fcount), !bVar9 ||
                (bVar9 = ON_BinaryArchive::WriteInt(file,(ulong)i_00,pOVar7->m_vi), !bVar9)) ||
               (bVar9 = ON_BinaryArchive::WriteInt(file,(ulong)pOVar7->m_Fcount,pOVar7->m_fi),
               !bVar9)))))) goto LAB_004fba69;
          uVar16 = uVar16 + 1;
        } while (uVar4 != uVar16);
        uVar16 = (ulong)uVar4;
      }
LAB_004fba69:
      bVar9 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if ((uint)uVar16 != uVar4 || !bVar9) {
        return false;
      }
    }
    else if (!bVar10) {
      return false;
    }
    iVar11 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    bVar10 = iVar11 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
    bVar9 = ON_BinaryArchive::WriteBool(file,bVar10 && iVar11 != 0);
    if ((bVar10 && iVar11 != 0) && bVar9) {
      bVar9 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
      if (!bVar9) {
        return false;
      }
      uVar4 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
      bVar9 = ON_BinaryArchive::WriteInt(file,uVar4);
      if (!bVar9) {
LAB_004fbb63:
        ON_BinaryArchive::EndWrite3dmChunk(file);
        return false;
      }
      bVar9 = true;
      if ((ulong)uVar4 != 0) {
        eVar12 = ON_BinaryArchive::Endian(file);
        if (eVar12 == big_endian) {
          pOVar8 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
          ON_BinaryArchive::ToggleByteOrder((ulong)(uVar4 * 3),8,pOVar8,pOVar8);
        }
        bVar9 = ON_BinaryArchive::WriteCompressedBuffer
                          (file,(ulong)uVar4 * 0x18,
                           (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
        if (bVar9 && eVar12 == big_endian) {
          pOVar8 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
          ON_BinaryArchive::ToggleByteOrder((ulong)(uVar4 * 3),8,pOVar8,pOVar8);
          bVar9 = true;
        }
      }
      bVar10 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if ((bVar9 & bVar10) == 0) {
        return false;
      }
    }
    else if (!bVar9) {
      return false;
    }
    bVar9 = ON_BinaryArchive::WriteBoundingBox(file,local_38);
  }
  if (bVar9 == false) {
    return false;
  }
  iVar11 = ON_BinaryArchive::Archive3dmVersion(file);
  if (OVar13 == 0) {
    return true;
  }
  if (iVar11 != 0x32) {
    return true;
  }
  bVar9 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  if (bVar9) {
    pOVar14 = ON_V5_MeshDoubleVertices::AttachV5(this);
    if (pOVar14 != (ON_V5_MeshDoubleVertices *)0x0) {
      ON_3dPointArray::operator=(&pOVar14->m_V5_dV,&this->m_dV);
      iVar11 = (pOVar14->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
      pOVar14->m_dcount = iVar11;
      OVar13 = ON_CRC32(0,(long)iVar11 * 0x18,
                        (pOVar14->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
      pOVar14->m_dCRC = OVar13;
      iVar11 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      pOVar14->m_fcount = iVar11;
      OVar13 = ON_CRC32(0,(long)iVar11 * 0xc,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
      pOVar14->m_fCRC = OVar13;
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool ON_Mesh::Write( ON_BinaryArchive& file ) const
{
  int i;
  //const int major_version = 1; // uncompressed
  //const int major_version = 2; // beta format (never used)
  const int major_version = 3; // compressed

  const int minor_version 
    = (file.Archive3dmVersion() >= 60) 
    //? 6  // ngons saved in V6 files as of mid November, 2013
    //? 7  // double precision vertices no longer on user data.
    ? 8  // double precision vertex box
    : 5;

  bool rc = file.Write3dmChunkVersion(major_version,minor_version);

  const unsigned int vcount = VertexUnsignedCount();
  const unsigned int fcount = FaceUnsignedCount();

  if (rc) rc = file.WriteInt( vcount );
  if (rc) rc = file.WriteInt( fcount );
  if (rc) rc = file.WriteInterval( m_packed_tex_domain[0] );
  if (rc) rc = file.WriteInterval( m_packed_tex_domain[1] );
  if (rc) rc = file.WriteInterval( m_srf_domain[0] );
  if (rc) rc = file.WriteInterval( m_srf_domain[1] );
  if (rc) rc = file.WriteDouble( 2, m_srf_scale );

  // legacy float precision vertex bounding box
  float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
  if (m_vertex_bbox.IsNotEmpty())
  {
    fbbox[0][0] = ON_FloatFloor(m_vertex_bbox.m_min.x);
    fbbox[0][1] = ON_FloatFloor(m_vertex_bbox.m_min.y);
    fbbox[0][2] = ON_FloatFloor(m_vertex_bbox.m_min.z);
    fbbox[1][0] = ON_FloatCeil(m_vertex_bbox.m_max.x);
    fbbox[1][1] = ON_FloatCeil(m_vertex_bbox.m_max.y);
    fbbox[1][2] = ON_FloatCeil(m_vertex_bbox.m_max.z);
  }
  if (rc) rc = file.WriteFloat( 6, &fbbox[0][0] );

  if (rc) rc = file.WriteFloat( 6, &m_nbox[0][0] );
  if (rc) rc = file.WriteFloat( 4, &m_tbox[0][0] );

  // archive int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
  i = -1;
  switch( m_mesh_is_closed )
  {
  case 0: // unset
    i = -1;
    break;
  case 1: // closed
    i = 1;
    break;
  case 2: // not closed
    i = 0;
    break;
  }
  if (rc) rc = file.WriteInt( i );

  unsigned char b = m_mesh_parameters ? 1 : 0;
  if (rc) rc = file.WriteChar(b);
  if (rc && b) {
    if (rc) rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if (rc) {
      rc = m_mesh_parameters->Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  for ( i = 0; rc && i < 4; i++ ) {
    b = m_kstat[i] ? 1 : 0;
    rc = file.WriteChar(b);
    if (b) {
      rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
      if (rc) {
        rc = m_kstat[i]->Write(file);
        if ( !file.EndWrite3dmChunk() )
          rc = false;
      }
    }
  }

  if (rc) rc = WriteFaceArray( vcount, fcount, file );

  if (rc) {
    // major version is a hard coded 3

    //if ( major_version == 1 )
    //  rc = Write_1(file);
    //else if ( major_version == 3 )
      rc = Write_2(vcount,file);
    //else
    //  rc = false;
  }

  // added for minor version 1.2 and 3.2
  i = m_packed_tex_rotate ? 1 : 0;
  if (rc) rc = file.WriteInt( i );

  // added for minor version 3.3
  if (rc) rc = file.WriteUuid( m_Ttag.m_mapping_id );
 
  // compressed m_S[]
  if ( rc && vcount > 0U ) 
  {
    // Before 201011049 there was a bug that let m_S[] arrays
    // with the wrong size get saved in files. 
    const unsigned int Scount = (vcount == m_S.UnsignedCount()) ? m_S.UnsignedCount() : 0;
    const ON::endian e = file.Endian();
    if (e == ON::endian::big_endian)
    {
      file.ToggleByteOrder( Scount*2, 8, m_S.Array(), (void*)m_S.Array() );
    }
    if (rc) rc = file.WriteCompressedBuffer( Scount*sizeof(ON_2dPoint),m_S.Array() );
    if (e == ON::endian::big_endian)
    {
      file.ToggleByteOrder( Scount*2, 8, m_S.Array(), (void*)m_S.Array() );
    }
  }

  // added for minor version 3.4
  if (rc) rc = m_Ttag.Write(file);

  // added for minor version 3.5
  if (rc) rc = file.WriteChar( m_mesh_is_manifold );
  if (rc) rc = file.WriteChar( m_mesh_is_oriented );
  if (rc) rc = file.WriteChar( m_mesh_is_solid );


  if ( rc && minor_version >= 6 )
  {
    // added n-gons version 3.6
    bool bHasNgons = HasNgons();    
    rc =  file.WriteBool(bHasNgons);
    if (rc && bHasNgons)
      rc = WriteMeshNgons(file,m_Ngon);

    if (rc && minor_version >= 7)
    {
      // added explicit double precision vertices chunk version 3.7
      // (used to be on user data)
      const bool bHasDoublePrecisionVertices = HasDoublePrecisionVertices();
      if (rc) rc = file.WriteBool(bHasDoublePrecisionVertices);
      if (rc && bHasDoublePrecisionVertices)
        rc = WriteMeshDoublePrecisionVertices(file, m_dV);

      if (rc && minor_version >= 8)
      {
        rc = file.WriteBoundingBox(m_vertex_bbox);
      }
    }
  }
  
  
  if (rc 
    && 50 == file.Archive3dmVersion() 
    && vcount > 0 
    && HasSynchronizedDoubleAndSinglePrecisionVertices() 
    )
  {
    // save double precision vertices using V5 user data.
    ON_V5_MeshDoubleVertices* ud = ON_V5_MeshDoubleVertices::AttachV5(this);
    if (nullptr != ud)
    {
      ud->m_V5_dV = m_dV;
      ud->m_dcount = ud->m_V5_dV.UnsignedCount();
      ud->m_dCRC = ud->DoubleCRC();
      ud->m_fcount = m_V.UnsignedCount();
      ud->m_fCRC = ON_V5_MeshDoubleVertices::FloatCRC(m_V);
      // This obsolete user data will be deleted after it is written to the V5 .3dm file.
    }
  }

  return rc;
}